

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<std::pair<int,_int>_>::erase
          (QPodArrayOps<std::pair<int,_int>_> *this,pair<int,_int> *b,qsizetype n)

{
  pair<int,_int> *__src;
  QArrayDataPointer<std::pair<int,_int>_> *pQVar1;
  pair<int,_int> *ppVar2;
  long in_RDX;
  QArrayDataPointer<std::pair<int,_int>_> *in_RSI;
  long in_RDI;
  pair<int,_int> *e;
  QArrayDataPointer<std::pair<int,_int>_> *in_stack_ffffffffffffffb0;
  
  __src = (pair<int,_int> *)(&in_RSI->d + in_RDX);
  pQVar1 = (QArrayDataPointer<std::pair<int,_int>_> *)
           QArrayDataPointer<std::pair<int,_int>_>::begin
                     ((QArrayDataPointer<std::pair<int,_int>_> *)0x8a7396);
  if ((in_RSI == pQVar1) &&
     (ppVar2 = QArrayDataPointer<std::pair<int,_int>_>::end(in_stack_ffffffffffffffb0),
     __src != ppVar2)) {
    *(pair<int,_int> **)(in_RDI + 8) = __src;
  }
  else {
    ppVar2 = QArrayDataPointer<std::pair<int,_int>_>::end(in_stack_ffffffffffffffb0);
    if (__src != ppVar2) {
      ppVar2 = QArrayDataPointer<std::pair<int,_int>_>::end(in_RSI);
      memmove(in_RSI,__src,((long)ppVar2 - (long)__src >> 3) << 3);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            ::memmove(static_cast<void *>(b), static_cast<void *>(e),
                      (static_cast<T *>(this->end()) - e) * sizeof(T));
        }
        this->size -= n;
    }